

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QStatusBarPrivate::SBItem>::removeAt(QList<QStatusBarPrivate::SBItem> *this,qsizetype i)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QStatusBarPrivate::SBItem>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QStatusBarPrivate::SBItem> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::erase
            ((QMovableArrayOps<QStatusBarPrivate::SBItem> *)this,(this->d).ptr + i,1);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }